

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O2

void release_thread_cache(void *p)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  FreeBlock *pFVar4;
  ulong uVar5;
  int iVar6;
  long *plVar7;
  CentralCache *cc;
  long *in_FS_OFFSET;
  
  lVar2 = *in_FS_OFFSET;
  uVar5 = 0;
  do {
    if (uVar5 == 0x104) {
      return;
    }
    plVar1 = (long *)(lVar2 + -0x1870 + uVar5 * 0x18);
    plVar3 = *(long **)(lVar2 + -0x1870 + uVar5 * 0x18);
    if (plVar3 == (long *)0x0) {
      if (plVar1[1] != 0) {
        plVar7 = (long *)0x0;
        iVar6 = 1;
        goto LAB_00133710;
      }
    }
    else {
      iVar6 = 0;
      do {
        plVar7 = plVar3;
        iVar6 = iVar6 + 1;
        plVar3 = (long *)*plVar7;
      } while ((long *)*plVar7 != (long *)0x0);
LAB_00133710:
      cc = centralCache + uVar5;
      spinlock_acquire(&cc->lock);
      if ((FreeBlock *)plVar1[1] != (FreeBlock *)0x0) {
        add_batch_to_central_cache(cc,(uint)uVar5,(FreeBlock *)plVar1[1]);
      }
      pFVar4 = (FreeBlock *)*plVar1;
      if (pFVar4 != (FreeBlock *)0x0) {
        *plVar7 = (long)centralCache[uVar5].freeList;
        centralCache[uVar5].freeList = pFVar4;
        if (iVar6 != ((0xffffU >> ((byte)(uVar5 >> 2) & 0x1f) & 0xff) - (int)plVar1[2]) + 1) {
          __assert_fail("freeListSize == batch_size(sizeClass) + 1 - tc->counter",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                        ,0x44d,"void release_thread_cache(void *)");
        }
        centralCache[uVar5].freeListSize = centralCache[uVar5].freeListSize + iVar6;
      }
      cc->lock = 0;
      *plVar1 = 0;
      plVar1[1] = 0;
      *(undefined4 *)(plVar1 + 2) = 0;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void release_thread_cache(void* p)
{
	unsigned int sizeClass = 0; (void)p;
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		ThreadCache* tc = &threadCache[sizeClass];
		if (tc->freeList || tc->tempList)
		{
			FreeBlock* tail = tc->freeList;
			unsigned int freeListSize = 1;
			CentralCache* cc = &centralCache[sizeClass];

			if (tail)
				while (tail->next)//search for end of list
					tail = tail->next, freeListSize++;

			SPINLOCK_ACQUIRE(&cc->lock);
			if (tc->tempList)
				add_batch_to_central_cache(cc, sizeClass, tc->tempList);
			if (tc->freeList) {//append tc->freeList to cc->freeList
				tail->next = cc->freeList;
				check_block_next(tail);
				cc->freeList = tc->freeList;
				LTALLOC_ASSERT(freeListSize == batch_size(sizeClass) + 1 - tc->counter);
				cc->freeListSize += freeListSize;
			}
			SPINLOCK_RELEASE(&cc->lock);

			tc->freeList = NULL;
			tc->tempList = NULL;
			tc->counter = 0;
		}
	}
}